

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<xilinx_do_not_care_values::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::InvalidAssertionExpr>
          (ASTVisitor<xilinx_do_not_care_values::MainVisitor,_true,_true,_false,_false> *this,
          InvalidAssertionExpr *t)

{
  bool bVar1;
  InvalidAssertionExpr *in_RSI;
  ASTVisitor<xilinx_do_not_care_values::MainVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = AssertionExpr::bad(&in_RSI->super_AssertionExpr);
  if (!bVar1) {
    visitDefault<slang::ast::InvalidAssertionExpr>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }